

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

QRect __thiscall QtMWidgets::SliderPrivate::handleRect(SliderPrivate *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  QPoint local_48;
  QPoint local_40;
  int local_38;
  int local_34;
  int hy;
  int hx;
  QRect cr;
  SliderPrivate *this_local;
  
  cr._8_8_ = this;
  auVar7 = QWidget::contentsRect();
  cr._0_8_ = auVar7._8_8_;
  _hy = auVar7._0_8_;
  local_34 = 0;
  local_38 = 0;
  iVar2 = QAbstractSlider::orientation();
  if (iVar2 == 2) {
    local_40 = QRect::topLeft((QRect *)&hy);
    iVar2 = QPoint::x(&local_40);
    iVar3 = QRect::width((QRect *)&hy);
    local_34 = ((iVar2 + iVar3 / 2) - this->radius) + 1;
    iVar3 = QAbstractSlider::minimum();
    iVar4 = QAbstractSlider::maximum();
    iVar5 = QAbstractSlider::sliderPosition();
    iVar6 = QRect::height((QRect *)&hy);
    iVar2 = this->radius;
    bVar1 = QAbstractSlider::invertedAppearance();
    local_38 = QStyle::sliderPositionFromValue
                         (iVar3,iVar4,iVar5,iVar6 + iVar2 * -2 + -2,(bool)(bVar1 & 1));
  }
  else {
    iVar3 = QAbstractSlider::minimum();
    iVar4 = QAbstractSlider::maximum();
    iVar5 = QAbstractSlider::sliderPosition();
    iVar6 = QRect::width((QRect *)&hy);
    iVar2 = this->radius;
    bVar1 = QAbstractSlider::invertedAppearance();
    local_34 = QStyle::sliderPositionFromValue
                         (iVar3,iVar4,iVar5,iVar6 + iVar2 * -2 + -2,(bool)(bVar1 & 1));
    local_34 = local_34 + 1;
    local_48 = QRect::topLeft((QRect *)&hy);
    iVar2 = QPoint::y(&local_48);
    iVar3 = QRect::height((QRect *)&hy);
    local_38 = (iVar2 + iVar3 / 2) - this->radius;
  }
  local_38 = local_38 + 1;
  iVar2 = this->radius * 2;
  QRect::QRect((QRect *)&this_local,local_34,local_38,iVar2,iVar2);
  return _this_local;
}

Assistant:

QRect
SliderPrivate::handleRect() const
{
	const QRect cr = q->contentsRect();

	int hx = 0, hy = 0;

	if( q->orientation() == Qt::Vertical )
	{
		hx = cr.topLeft().x() + cr.width() / 2 - radius + 1;
		hy = QStyle::sliderPositionFromValue( q->minimum(), q->maximum(),
			q->sliderPosition(), cr.height() - radius * 2 - 2,
			q->invertedAppearance() ) + 1;
	}
	else
	{
		hx = QStyle::sliderPositionFromValue( q->minimum(), q->maximum(),
			q->sliderPosition(), cr.width() - radius * 2 - 2,
			q->invertedAppearance() ) + 1;
		hy = cr.topLeft().y() + cr.height() / 2 - radius + 1;
	}

	return QRect( hx, hy, radius * 2, radius * 2 );
}